

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

void xmlParseInternalSubset(xmlParserCtxtPtr ctxt)

{
  int iVar1;
  xmlChar *pxVar2;
  xmlChar *pxVar3;
  unsigned_long uVar4;
  xmlChar xVar5;
  xmlParserInputPtr pxVar6;
  xmlChar *check;
  
  if (*ctxt->input->cur == '[') {
    iVar1 = ctxt->inputNr;
    ctxt->instate = XML_PARSER_DTD;
    ctxt->curly = 1;
    xmlNextChar(ctxt);
    while( true ) {
      do {
        pxVar2 = ctxt->input->cur;
        xVar5 = *pxVar2;
        if ((xVar5 == ']') && (ctxt->inputNr <= iVar1)) goto LAB_00167be2;
        if (ctxt->instate == XML_PARSER_EOF) goto LAB_00167bde;
        uVar4 = ctxt->input->consumed;
        xmlSkipBlankChars(ctxt);
        xmlParseMarkupDecl(ctxt);
        switchD_00159f08::default(ctxt);
        pxVar6 = ctxt->input;
        if ((((1 < ctxt->inputNr) && (pxVar6->filename != (char *)0x0)) &&
            (pxVar3 = pxVar6->cur, *pxVar3 == '<')) && ((pxVar3[1] == '!' && (pxVar3[2] == '[')))) {
          xmlParseConditionalSections(ctxt);
          pxVar6 = ctxt->input;
        }
      } while ((pxVar6->cur != pxVar2) || ((ulong)(uint)uVar4 != pxVar6->consumed));
      xmlFatalErr(ctxt,XML_ERR_INTERNAL_ERROR,
                  "xmlParseInternalSubset: error detected in Markup declaration\n");
      if (ctxt->inputNr <= iVar1) break;
      xmlPopInput(ctxt);
    }
    xVar5 = *ctxt->input->cur;
LAB_00167bde:
    if (xVar5 == ']') {
LAB_00167be2:
      ctxt->curly = 0;
      xmlNextChar(ctxt);
      xmlSkipBlankChars(ctxt);
    }
  }
  if (ctxt->mlType == XML_TYPE_SML) {
    xVar5 = *ctxt->input->cur;
    if ((xVar5 == '\n') || (xVar5 == ';')) goto LAB_00167c30;
  }
  else if ((ctxt->mlType == XML_TYPE_XML) && (*ctxt->input->cur == '>')) {
LAB_00167c30:
    xmlNextChar(ctxt);
    return;
  }
  xmlFatalErr(ctxt,XML_ERR_DOCTYPE_NOT_FINISHED,(char *)0x0);
  return;
}

Assistant:

static void
xmlParseInternalSubset(xmlParserCtxtPtr ctxt) {

    DEBUG_ENTER(("xmlParseInternalSubset(%s);\n", dbgCtxt(ctxt)));

    /*
     * Is there any DTD definition ?
     */
    if (RAW == '[') {
        int baseInputNr = ctxt->inputNr;
        ctxt->instate = XML_PARSER_DTD;
        ctxt->curly = 1;
        NEXT;
	/*
	 * Parse the succession of Markup declarations and
	 * PEReferences.
	 * Subsequence (markupdecl | PEReference | S)*
	 */
	while (((RAW != ']') || (ctxt->inputNr > baseInputNr)) &&
               (ctxt->instate != XML_PARSER_EOF)) {
	    const xmlChar *check = CUR_PTR;
	    unsigned int cons = ctxt->input->consumed;

	    SKIP_BLANKS;
	    xmlParseMarkupDecl(ctxt);
	    xmlParsePEReference(ctxt);

            /*
             * Conditional sections are allowed from external entities included
             * by PE References in the internal subset.
             */
            if ((ctxt->inputNr > 1) && (ctxt->input->filename != NULL) &&
                (RAW == '<') && (NXT(1) == '!') && (NXT(2) == '[')) {
                xmlParseConditionalSections(ctxt);
            }

	    if ((CUR_PTR == check) && (cons == ctxt->input->consumed)) {
		xmlFatalErr(ctxt, XML_ERR_INTERNAL_ERROR,
	     "xmlParseInternalSubset: error detected in Markup declaration\n");
                if (ctxt->inputNr > baseInputNr)
                    xmlPopInput(ctxt);
                else
		    break;
	    }
	}
	if (RAW == ']') {
	    ctxt->curly = 0;
	    NEXT;
	    SKIP_BLANKS;
	}
    }

    /*
     * We should be at the end of the DOCTYPE declaration.
     */
    if (!RAW_IS_GT_MLI) { /* RAW != '>' */
	xmlFatalErr(ctxt, XML_ERR_DOCTYPE_NOT_FINISHED, NULL);
	RETURN();
    }
    NEXT;
    RETURN();
}